

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O2

void __thiscall AviWriter::~AviWriter(AviWriter *this)

{
  queue<AVIIndexRecord_*,_std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>_> *this_00
  ;
  size_type sVar1;
  
  if ((FILE *)this->fOutFid != (FILE *)0x0) {
    fclose((FILE *)this->fOutFid);
  }
  this_00 = &this->indexRecords;
  sVar1 = std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>::size(&this_00->c);
  if (sVar1 != 0) {
    operator_delete(*(this->indexRecords).c.
                     super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur,0x10);
    std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>::pop_front(&this_00->c);
  }
  std::_Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>::~_Deque_base
            ((_Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_> *)this_00);
  return;
}

Assistant:

AviWriter::~AviWriter()
{
    if (fOutFid != NULL)
        fclose(fOutFid);

    if (indexRecords.size())
    {
        auto record = indexRecords.front();
        delete record;
        indexRecords.pop();
    }
}